

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_bootstrap_context(sexp_uint_t size,sexp_uint_t max_size)

{
  sexp_heap_conflict heap;
  sexp psVar1;
  size_t size_00;
  sexp_struct local_60d8;
  
  size_00 = 0x200000;
  if (0x1fff < size) {
    size_00 = size + 0x1f & 0xffffffffffffffe0;
  }
  psVar1 = (sexp)0x0;
  heap = sexp_make_heap(size_00,max_size + 0x1f & 0xffffffffffffffe0,0);
  if (heap != (sexp_heap_conflict)0x0) {
    local_60d8.tag = 0x24;
    local_60d8.value.context.mark_stack_ptr = (sexp_mark_stack_ptr_t *)0x0;
    local_60d8.value.context.saves = (sexp_gc_var_t *)0x0;
    local_60d8.value.context.heap = heap;
    psVar1 = (sexp)sexp_alloc(&local_60d8,0x60c8);
    if ((psVar1 == (sexp)0x0) || ((((ulong)psVar1 & 3) == 0 && (psVar1->tag == 0x13)))) {
      sexp_free_heap(heap);
    }
    else {
      psVar1->tag = 0x24;
      (psVar1->value).context.heap = heap;
    }
  }
  return psVar1;
}

Assistant:

sexp sexp_bootstrap_context (sexp_uint_t size, sexp_uint_t max_size) {
  sexp ctx;
  sexp_heap heap;
  struct sexp_struct dummy_ctx;
  if (size < SEXP_MINIMUM_HEAP_SIZE) size = SEXP_INITIAL_HEAP_SIZE;
  size = sexp_heap_align(size);
  max_size = sexp_heap_align(max_size);
  heap = sexp_make_heap(size, max_size, 0);
  if (!heap) return 0;
  sexp_pointer_tag(&dummy_ctx) = SEXP_CONTEXT;
  sexp_context_mark_stack_ptr(&dummy_ctx) = NULL;
  sexp_context_saves(&dummy_ctx) = NULL;
  sexp_context_heap(&dummy_ctx) = heap;
  ctx = sexp_alloc_type(&dummy_ctx, context, SEXP_CONTEXT);
  if (!ctx || sexp_exceptionp(ctx)) {
    sexp_free_heap(heap);
  } else {
    sexp_context_heap(ctx) = heap;
#if SEXP_USE_FIXED_CHUNK_SIZE_HEAPS
    heap->chunk_size = sexp_heap_align(1);
    heap->next = sexp_make_heap(size, max_size, 0);
    if (heap->next) {
      heap->next->chunk_size = sexp_heap_align(1 + sexp_heap_align(1));
      heap->next->next = sexp_make_heap(size, max_size, 0);
      if (heap->next->next) {
        heap->next->next->chunk_size = sexp_heap_align(1 + sexp_heap_align(1 + sexp_heap_align(1)));
        heap->next->next->next = sexp_make_heap(size, max_size, 0);
      }
    }
#endif
  }
  return ctx;
}